

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squeezenet.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  int *piVar2;
  char cVar3;
  int iVar4;
  ulong uVar5;
  int i;
  ulong uVar6;
  long lVar7;
  vector<float,_std::allocator<float>_> cls_scores;
  Extractor ex;
  Net squeezenet;
  Mat local_118;
  Mat local_d0;
  float mean_vals [3];
  Mat m;
  int local_70;
  int local_6c;
  uchar *local_68;
  
  if (argc == 2) {
    pcVar1 = argv[1];
    std::__cxx11::string::string((string *)&squeezenet,pcVar1,(allocator *)&local_d0);
    cv::imread((string *)&m,(int)&squeezenet);
    std::__cxx11::string::~string((string *)&squeezenet);
    cVar3 = cv::Mat::empty();
    if (cVar3 == '\0') {
      cls_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      cls_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      cls_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ncnn::Net::Net(&squeezenet);
      squeezenet.opt.use_vulkan_compute = true;
      iVar4 = ncnn::Net::load_param(&squeezenet,"squeezenet_v1.1.param");
      if ((iVar4 != 0) ||
         (iVar4 = ncnn::Net::load_model(&squeezenet,"squeezenet_v1.1.bin"), iVar4 != 0)) {
        exit(-1);
      }
      ncnn::Mat::from_pixels_resize
                (&local_d0,local_68,2,local_6c,local_70,0xe3,0xe3,(Allocator *)0x0);
      mean_vals[0] = 104.0;
      mean_vals[1] = 117.0;
      mean_vals[2] = 123.0;
      ncnn::Mat::substract_mean_normalize(&local_d0,mean_vals,(float *)0x0);
      ncnn::Net::create_extractor((Net *)&ex);
      ncnn::Extractor::input(&ex,"data",&local_d0);
      local_118.cstep = 0;
      local_118.data = (void *)0x0;
      local_118.refcount._0_4_ = 0;
      local_118.refcount._4_4_ = 0;
      local_118.elemsize._0_4_ = 0;
      local_118._20_8_ = 0;
      local_118.allocator = (Allocator *)0x0;
      local_118.dims = 0;
      local_118.w = 0;
      local_118.h = 0;
      local_118.d = 0;
      local_118.c = 0;
      ncnn::Extractor::extract(&ex,"prob",&local_118,0);
      std::vector<float,_std::allocator<float>_>::resize(&cls_scores,(long)local_118.w);
      uVar5 = 0;
      uVar6 = (ulong)(uint)local_118.w;
      if (local_118.w < 1) {
        uVar6 = uVar5;
      }
      for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
        cls_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
        ._M_start[uVar5] = *(float *)((long)local_118.data + uVar5 * 4);
      }
      piVar2 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (local_118.allocator == (Allocator *)0x0) {
            free(local_118.data);
          }
          else {
            (*(local_118.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      ncnn::Extractor::~Extractor(&ex);
      if (local_d0.refcount != (int *)0x0) {
        LOCK();
        *local_d0.refcount = *local_d0.refcount + -1;
        UNLOCK();
        if (*local_d0.refcount == 0) {
          if (local_d0.allocator == (Allocator *)0x0) {
            free(local_d0.data);
          }
          else {
            (*(local_d0.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      ncnn::Net::~Net(&squeezenet);
      squeezenet.opt.blob_allocator = (Allocator *)0x0;
      squeezenet._vptr_Net = (_func_int **)0x0;
      squeezenet.opt.lightmode = false;
      squeezenet.opt._1_3_ = 0;
      squeezenet.opt.num_threads = 0;
      uVar6 = (ulong)((long)cls_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)cls_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2;
      iVar4 = (int)uVar6;
      std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::resize
                ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                 &squeezenet,(long)iVar4);
      uVar5 = 0;
      uVar6 = uVar6 & 0xffffffff;
      if (iVar4 < 1) {
        uVar6 = uVar5;
      }
      for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
        *(float *)(squeezenet._vptr_Net + uVar5) =
             cls_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start[uVar5];
        *(int *)((long)squeezenet._vptr_Net + uVar5 * 8 + 4) = (int)uVar5;
      }
      std::
      __partial_sort<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<std::pair<float,int>>>>
                (squeezenet._vptr_Net,squeezenet._vptr_Net + 3,squeezenet.opt._0_8_);
      for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
        fprintf(_stderr,"%d = %f\n",SUB84((double)*(float *)(squeezenet._vptr_Net + lVar7),0),
                (ulong)*(uint *)((long)squeezenet._vptr_Net + lVar7 * 8 + 4));
      }
      std::_Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::
      ~_Vector_base((_Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                    &squeezenet);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&cls_scores.super__Vector_base<float,_std::allocator<float>_>);
      iVar4 = 0;
    }
    else {
      fprintf(_stderr,"cv::imread %s failed\n",pcVar1);
      iVar4 = -1;
    }
    cv::Mat::~Mat(&m);
  }
  else {
    fprintf(_stderr,"Usage: %s [imagepath]\n",*argv);
    iVar4 = -1;
  }
  return iVar4;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        fprintf(stderr, "Usage: %s [imagepath]\n", argv[0]);
        return -1;
    }

    const char* imagepath = argv[1];

    cv::Mat m = cv::imread(imagepath, 1);
    if (m.empty())
    {
        fprintf(stderr, "cv::imread %s failed\n", imagepath);
        return -1;
    }

    std::vector<float> cls_scores;
    detect_squeezenet(m, cls_scores);

    print_topk(cls_scores, 3);

    return 0;
}